

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O0

quad<unsigned_short> __thiscall
charls::
jls_codec<charls::default_traits<unsigned_short,_charls::quad<unsigned_short>_>,_charls::decoder_strategy>
::decode_run_interruption_pixel
          (jls_codec<charls::default_traits<unsigned_short,_charls::quad<unsigned_short>_>,_charls::decoder_strategy>
           *this,quad<unsigned_short> ra,quad<unsigned_short> rb)

{
  int32_t iVar1;
  unsigned_short uVar2;
  unsigned_short uVar3;
  unsigned_short uVar4;
  int iVar5;
  reference pvVar6;
  default_traits<unsigned_short,_charls::quad<unsigned_short>_> *this_00;
  uchar *puVar7;
  size_t *siglen;
  size_t *siglen_00;
  size_t *siglen_01;
  size_t *siglen_02;
  triplet<unsigned_short> triplet_value;
  uchar *puVar8;
  uint uVar9;
  uint predicted_value;
  array<charls::context_run_mode,_2UL> *this_01;
  size_t in_R8;
  triplet<unsigned_short> local_3e;
  uint local_38;
  int32_t local_34;
  int32_t error_value4;
  int32_t error_value3;
  int32_t error_value2;
  int32_t error_value1;
  jls_codec<charls::default_traits<unsigned_short,_charls::quad<unsigned_short>_>,_charls::decoder_strategy>
  *this_local;
  quad<unsigned_short> rb_local;
  quad<unsigned_short> ra_local;
  
  this_01 = &this->context_run_mode_;
  _error_value2 = this;
  this_local = (jls_codec<charls::default_traits<unsigned_short,_charls::quad<unsigned_short>_>,_charls::decoder_strategy>
                *)rb;
  rb_local = ra;
  pvVar6 = std::array<charls::context_run_mode,_2UL>::operator[](this_01,0);
  error_value3 = decode_run_interruption_error(this,pvVar6);
  pvVar6 = std::array<charls::context_run_mode,_2UL>::operator[](this_01,0);
  error_value4 = decode_run_interruption_error(this,pvVar6);
  pvVar6 = std::array<charls::context_run_mode,_2UL>::operator[](this_01,0);
  local_34 = decode_run_interruption_error(this,pvVar6);
  pvVar6 = std::array<charls::context_run_mode,_2UL>::operator[](this_01,0);
  local_38 = decode_run_interruption_error(this,pvVar6);
  iVar1 = error_value3;
  puVar7 = (uchar *)(ulong)local_38;
  this_00 = &this->traits_;
  uVar9 = (uint)(ushort)this_local;
  iVar5 = charls::sign((EVP_PKEY_CTX *)
                       (ulong)(uVar9 - rb_local.super_triplet<unsigned_short>.field_0.v1),
                       (uchar *)pvVar6,siglen,puVar7,in_R8);
  puVar8 = (uchar *)(ulong)uVar9;
  uVar2 = default_traits<unsigned_short,_charls::quad<unsigned_short>_>::
          compute_reconstructed_sample(this_00,uVar9,iVar1 * iVar5);
  iVar1 = error_value4;
  uVar9 = (uint)this_local._2_2_;
  iVar5 = charls::sign((EVP_PKEY_CTX *)
                       (ulong)(uVar9 - rb_local.super_triplet<unsigned_short>.field_1.v2),puVar8,
                       siglen_00,puVar7,in_R8);
  puVar8 = (uchar *)(ulong)uVar9;
  uVar3 = default_traits<unsigned_short,_charls::quad<unsigned_short>_>::
          compute_reconstructed_sample(this_00,uVar9,iVar1 * iVar5);
  iVar1 = local_34;
  uVar9 = (uint)this_local._4_2_;
  iVar5 = charls::sign((EVP_PKEY_CTX *)
                       (ulong)(uVar9 - rb_local.super_triplet<unsigned_short>.field_2.v3),puVar8,
                       siglen_01,puVar7,in_R8);
  uVar4 = default_traits<unsigned_short,_charls::quad<unsigned_short>_>::
          compute_reconstructed_sample(this_00,uVar9,iVar1 * iVar5);
  puVar8 = (uchar *)(ulong)(uint)uVar2;
  puVar7 = (uchar *)(ulong)uVar4;
  triplet<unsigned_short>::triplet(&local_3e,(uint)uVar2,(uint)uVar3,(uint)uVar4);
  uVar9 = local_38;
  predicted_value = (uint)this_local._6_2_;
  iVar5 = charls::sign((EVP_PKEY_CTX *)(ulong)(predicted_value - rb_local.field_0.v4),puVar8,
                       siglen_02,puVar7,in_R8);
  uVar2 = default_traits<unsigned_short,_charls::quad<unsigned_short>_>::
          compute_reconstructed_sample(this_00,predicted_value,uVar9 * iVar5);
  triplet_value.field_2.v3 = local_3e.field_2.v3;
  triplet_value.field_0 = local_3e.field_0;
  triplet_value.field_1 = local_3e.field_1;
  quad<unsigned_short>::quad(&ra_local,triplet_value,(uint)uVar2);
  return ra_local;
}

Assistant:

quad<sample_type> decode_run_interruption_pixel(quad<sample_type> ra, quad<sample_type> rb)
    {
        const int32_t error_value1{decode_run_interruption_error(context_run_mode_[0])};
        const int32_t error_value2{decode_run_interruption_error(context_run_mode_[0])};
        const int32_t error_value3{decode_run_interruption_error(context_run_mode_[0])};
        const int32_t error_value4{decode_run_interruption_error(context_run_mode_[0])};

        return quad<sample_type>(
            triplet<sample_type>(traits_.compute_reconstructed_sample(rb.v1, error_value1 * sign(rb.v1 - ra.v1)),
                                 traits_.compute_reconstructed_sample(rb.v2, error_value2 * sign(rb.v2 - ra.v2)),
                                 traits_.compute_reconstructed_sample(rb.v3, error_value3 * sign(rb.v3 - ra.v3))),
            traits_.compute_reconstructed_sample(rb.v4, error_value4 * sign(rb.v4 - ra.v4)));
    }